

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O2

XMLNode __thiscall XMLParser::XMLNode::deepCopy(XMLNode *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  XMLNodeData *pXVar3;
  undefined8 uVar4;
  char *pcVar5;
  XMLAttribute *pXVar6;
  int *__dest;
  char **ppcVar7;
  XMLClear *pXVar8;
  XMLNode *pXVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long *in_RSI;
  long lVar13;
  size_t sVar14;
  bool bVar15;
  XMLNode local_38;
  
  if ((undefined8 *)*in_RSI == (undefined8 *)0x0) {
    XMLNode(this,(XMLNode *)&emptyXMLNode);
  }
  else {
    pcVar5 = stringDup(*(char **)*in_RSI,-1);
    XMLNode(this,(XMLNodeData *)0x0,pcVar5,*(char *)(*in_RSI + 0x18));
    pXVar3 = this->d;
    lVar12 = *in_RSI;
    lVar11 = (long)*(int *)(lVar12 + 0x14);
    if (lVar11 != 0) {
      pXVar3->nAttribute = *(int *)(lVar12 + 0x14);
      sVar14 = lVar11 << 4;
      pXVar6 = (XMLAttribute *)malloc(sVar14);
      pXVar3->pAttribute = pXVar6;
      while (bVar15 = lVar11 != 0, lVar11 = lVar11 + -1, bVar15) {
        pcVar5 = stringDup(*(char **)(*(long *)(*in_RSI + 0x40) + -0x10 + sVar14),-1);
        *(char **)((long)&pXVar3->pAttribute[-1].lpszName + sVar14) = pcVar5;
        pcVar5 = stringDup(*(char **)(*(long *)(*in_RSI + 0x40) + -8 + sVar14),-1);
        *(char **)((long)pXVar3->pAttribute + (sVar14 - 8)) = pcVar5;
        sVar14 = sVar14 - 0x10;
      }
      lVar12 = *in_RSI;
    }
    if (*(long *)(lVar12 + 0x48) == 0) {
      iVar10 = *(int *)(lVar12 + 0xc);
    }
    else {
      iVar10 = *(int *)(lVar12 + 0xc);
      sVar14 = (size_t)((*(int *)(lVar12 + 8) + iVar10 + *(int *)(lVar12 + 0x10)) * 4);
      __dest = (int *)malloc(sVar14);
      pXVar3->pOrder = __dest;
      memcpy(__dest,*(void **)(lVar12 + 0x48),sVar14);
    }
    if (iVar10 != 0) {
      pXVar3->nText = iVar10;
      lVar12 = (long)iVar10;
      ppcVar7 = (char **)malloc(lVar12 * 8);
      pXVar3->pText = ppcVar7;
      while (bVar15 = lVar12 != 0, lVar12 = lVar12 + -1, bVar15) {
        pcVar5 = stringDup(*(char **)(*(long *)(*in_RSI + 0x30) + lVar12 * 8),-1);
        pXVar3->pText[lVar12] = pcVar5;
      }
      lVar12 = *in_RSI;
    }
    lVar11 = (long)*(int *)(lVar12 + 0x10);
    if (lVar11 != 0) {
      pXVar3->nClear = *(int *)(lVar12 + 0x10);
      sVar14 = lVar11 * 0x18;
      pXVar8 = (XMLClear *)malloc(sVar14);
      pXVar3->pClear = pXVar8;
      while (bVar15 = lVar11 != 0, lVar11 = lVar11 + -1, bVar15) {
        lVar12 = *(long *)(*in_RSI + 0x38);
        puVar1 = (undefined8 *)(lVar12 + -0x10 + sVar14);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pXVar8 + (sVar14 - 0x10));
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        pcVar5 = stringDup(*(char **)(lVar12 + -0x18 + sVar14),-1);
        pXVar8 = pXVar3->pClear;
        *(char **)((long)&pXVar8[-1].lpszValue + sVar14) = pcVar5;
        sVar14 = sVar14 - 0x18;
      }
      lVar12 = *in_RSI;
    }
    lVar11 = (long)*(int *)(lVar12 + 8);
    if (lVar11 != 0) {
      pXVar3->nChild = *(int *)(lVar12 + 8);
      pXVar9 = (XMLNode *)malloc(lVar11 * 8);
      pXVar3->pChild = pXVar9;
      lVar12 = lVar11 * 8;
      for (lVar13 = -lVar11; lVar13 != 0; lVar13 = lVar13 + 1) {
        *(undefined8 *)((long)&pXVar9[-1].d + lVar12) = 0;
        deepCopy(&local_38);
        operator=((XMLNode *)((long)&pXVar3->pChild[-1].d + lVar12),&local_38);
        ~XMLNode(&local_38);
        pXVar9 = pXVar3->pChild;
        *(XMLNodeData **)(*(long *)((long)&pXVar9[-1].d + lVar12) + 0x20) = pXVar3;
        lVar12 = lVar12 + -8;
      }
    }
  }
  return (XMLNode)this;
}

Assistant:

XMLNode XMLNode::deepCopy() const
    {
        if(!d)
            return XMLNode::emptyXMLNode;
        XMLNode x(NULL, stringDup(d->lpszName), d->isDeclaration);
        XMLNodeData * p = x.d;
        int n = d->nAttribute;
        if(n)
        {
            p->nAttribute = n;
            p->pAttribute = (XMLAttribute *)malloc(n * sizeof(XMLAttribute));
            while(n--)
            {
                p->pAttribute[n].lpszName = stringDup(d->pAttribute[n].lpszName);
                p->pAttribute[n].lpszValue = stringDup(d->pAttribute[n].lpszValue);
            }
        }
        if(d->pOrder)
        {
            n = (d->nChild + d->nText + d->nClear) * sizeof(int);
            p->pOrder = (int *)malloc(n);
            memcpy(p->pOrder, d->pOrder, n);
        }
        n = d->nText;
        if(n)
        {
            p->nText = n;
            p->pText = (XMLCSTR *)malloc(n * sizeof(XMLCSTR));
            while(n--)
                p->pText[n] = stringDup(d->pText[n]);
        }
        n = d->nClear;
        if(n)
        {
            p->nClear = n;
            p->pClear = (XMLClear *)malloc(n * sizeof(XMLClear));
            while(n--)
            {
                p->pClear[n].lpszCloseTag = d->pClear[n].lpszCloseTag;
                p->pClear[n].lpszOpenTag = d->pClear[n].lpszOpenTag;
                p->pClear[n].lpszValue = stringDup(d->pClear[n].lpszValue);
            }
        }
        n = d->nChild;
        if(n)
        {
            p->nChild = n;
            p->pChild = (XMLNode *)malloc(n * sizeof(XMLNode));
            while(n--)
            {
                p->pChild[n].d = NULL;
                p->pChild[n] = d->pChild[n].deepCopy();
                p->pChild[n].d->pParent = p;
            }
        }
        return x;
    }